

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

GdlExpression * __thiscall
GdlNumericExpression::ConvertFeatureSettingValue
          (GdlNumericExpression *this,GdlFeatureDefn *pfeat,bool *fErr)

{
  bool bVar1;
  string *in_RDX;
  GdlFeatureDefn *in_RSI;
  GdlExpression *in_RDI;
  GrcErrorList *unaff_retaddr;
  allocator local_39;
  string local_38 [32];
  GdlExpression *pGVar2;
  int nID;
  
  pGVar2 = in_RDI;
  bVar1 = GdlFeatureDefn::IsLanguageFeature(in_RSI);
  nID = (int)((ulong)pGVar2 >> 0x20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"Numeric value where language ID string expected",&local_39);
    GrcErrorList::AddWarning(unaff_retaddr,nID,(GdlObject *)in_RSI,in_RDX);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return in_RDI;
}

Assistant:

GdlExpression * GdlNumericExpression::ConvertFeatureSettingValue(GdlFeatureDefn * pfeat, bool & fErr)
{
	if (pfeat->IsLanguageFeature())
		g_errorList.AddWarning(2518, this,
			"Numeric value where language ID string expected");

	return this;
}